

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ViewPattern.cpp
# Opt level: O2

void __thiscall ViewPattern::ViewPattern(ViewPattern *this,string *name,View *view)

{
  std::__cxx11::string::string((string *)this,(string *)name);
  this->view = view;
  return;
}

Assistant:

ViewPattern::ViewPattern(const string &name, View *view) : name(name), view(view) {}